

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall
wasm::ValidationInfo::shouldBeSubTypeIgnoringShared
          (ValidationInfo *this,Type left,Type right,Expression *curr,char *text,Function *func)

{
  bool bVar1;
  Shareability share;
  BasicHeapType BVar2;
  HeapType HVar3;
  Type local_58;
  Type matchedRight;
  HeapType ht;
  Type local_40;
  Type left_local;
  Type right_local;
  
  local_40.id = left.id;
  left_local.id = right.id;
  if ((6 < right.id) && ((right.id & 1) == 0)) {
    HVar3 = wasm::Type::getHeapType(&left_local);
    if (HVar3.id < 0x7d) {
      if ((left.id & 1) == 0 && 6 < left.id) {
        matchedRight.id = (uintptr_t)wasm::Type::getHeapType(&local_40);
        share = HeapType::getShared((HeapType *)&matchedRight);
      }
      else {
        share = Unshared;
      }
      matchedRight.id = (uintptr_t)wasm::Type::getHeapType(&left_local);
      BVar2 = HeapType::getBasic((HeapType *)&matchedRight,share);
      HVar3.id._4_4_ = 0;
      HVar3.id._0_4_ = BVar2;
      wasm::Type::Type(&local_58,HVar3,(uint)(((uint)left_local.id & 3) == 2 && 6 < left_local.id),
                       Inexact);
      bVar1 = shouldBeSubType(this,local_40,local_58,curr,text,func);
      return bVar1;
    }
  }
  __assert_fail("right.isRef() && right.getHeapType().isBasic()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-validator.cpp"
                ,0xe5,
                "bool wasm::ValidationInfo::shouldBeSubTypeIgnoringShared(Type, Type, Expression *, const char *, Function *)"
               );
}

Assistant:

bool shouldBeSubTypeIgnoringShared(Type left,
                                     Type right,
                                     Expression* curr,
                                     const char* text,
                                     Function* func = nullptr) {
    assert(right.isRef() && right.getHeapType().isBasic());
    auto share = left.isRef() ? left.getHeapType().getShared() : Unshared;
    auto ht = right.getHeapType();
    auto matchedRight = Type(ht.getBasic(share), right.getNullability());
    return shouldBeSubType(left, matchedRight, curr, text, func);
  }